

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall Diligent::DeviceContextGLImpl::BeginSubpass(DeviceContextGLImpl *this)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  GLuint GVar4;
  DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
  *this_00;
  Char *pCVar5;
  FramebufferGLImpl *pFVar6;
  ISwapChainGL *pIVar7;
  ITextureView **ppIVar8;
  TextureViewGLImpl *pTVar9;
  TextureBaseGL *pTVar10;
  RenderPassBase<Diligent::EngineGLImplTraits> *pRVar11;
  pair<unsigned_int,_unsigned_int> pVar12;
  reference pvVar13;
  char (*in_RCX) [20];
  DepthStencilClearValue *ClearVal;
  TextureFormatAttribs *pTStack_118;
  CLEAR_DEPTH_STENCIL_FLAGS ClearFlags;
  TextureFormatAttribs *FmtAttribs;
  pair<unsigned_int,_unsigned_int> FirstLastUse_1;
  RenderPassAttachmentDesc *AttachmentDesc_1;
  TextureBaseGL *pDepthTexGL;
  TextureViewGLImpl *pDSV;
  uint uStack_e8;
  Uint32 DepthAttachmentIndex;
  pair<unsigned_int,_unsigned_int> FirstLastUse;
  RenderPassAttachmentDesc *AttachmentDesc;
  TextureBaseGL *pColorTexGL;
  TextureViewGLImpl *pRTV;
  AttachmentReference *RTAttachmentRef;
  Uint32 rt;
  GLuint local_a4;
  SubpassFramebuffers *pSStack_a0;
  GLuint DefaultFBOHandle;
  GLFrameBufferObj *RenderTargetFBO;
  FramebufferDesc *FBDesc;
  SubpassDesc *SubpassDesc;
  string msg_2;
  RenderPassDesc *RPDesc;
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  DeviceContextGLImpl *this_local;
  
  msg.field_2._8_8_ = this;
  bVar3 = RefCntAutoPtr<Diligent::RenderPassGLImpl>::operator!
                    (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                      m_pActiveRenderPass);
  if (bVar3) {
    FormatString<char[26],char[20]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pActiveRenderPass",in_RCX);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [20])0x1ce;
    DebugAssertionFailed
              (pCVar5,"BeginSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x1ce);
    std::__cxx11::string::~string((string *)local_30);
  }
  bVar3 = RefCntAutoPtr<Diligent::FramebufferGLImpl>::operator!
                    (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                      m_pBoundFramebuffer);
  if (bVar3) {
    FormatString<char[26],char[20]>
              ((string *)&RPDesc,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pBoundFramebuffer",in_RCX);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"BeginSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x1cf);
    std::__cxx11::string::~string((string *)&RPDesc);
  }
  this_00 = (DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
             *)RefCntAutoPtr<Diligent::RenderPassGLImpl>::operator->
                         (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                           m_pActiveRenderPass);
  msg_2.field_2._8_8_ =
       DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
       ::GetDesc(this_00);
  if (((RenderPassDesc *)msg_2.field_2._8_8_)->SubpassCount <=
      (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex) {
    FormatString<char[26],char[37]>
              ((string *)&SubpassDesc,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_SubpassIndex < RPDesc.SubpassCount",
               (char (*) [37])msg_2.field_2._8_8_);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"BeginSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x1d1);
    std::__cxx11::string::~string((string *)&SubpassDesc);
  }
  FBDesc = (FramebufferDesc *)
           (*(long *)(msg_2.field_2._8_8_ + 0x20) +
           (ulong)(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex *
           0x48);
  pFVar6 = RefCntAutoPtr<Diligent::FramebufferGLImpl>::operator->
                     (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                       m_pBoundFramebuffer);
  RenderTargetFBO =
       (GLFrameBufferObj *)
       DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
       ::GetDesc((DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                  *)pFVar6);
  pFVar6 = RefCntAutoPtr<Diligent::FramebufferGLImpl>::operator->
                     (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                       m_pBoundFramebuffer);
  pSStack_a0 = FramebufferGLImpl::GetSubpassFramebuffer
                         (pFVar6,(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                                 m_SubpassIndex);
  GVar4 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int((GLObjWrapper *)pSStack_a0);
  if (GVar4 == 0) {
    pIVar7 = RefCntAutoPtr<Diligent::ISwapChainGL>::operator->(&this->m_pSwapChain);
    local_a4 = (*(pIVar7->super_ISwapChain).super_IObject._vptr_IObject[0xc])();
    GVar4 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                      ((GLObjWrapper *)&this->m_DefaultFBO);
    if (GVar4 != local_a4) {
      GLObjectWrappers::GLFBOCreateReleaseHelper::GLFBOCreateReleaseHelper
                ((GLFBOCreateReleaseHelper *)((long)&RTAttachmentRef + 4),local_a4);
      GLObjectWrappers::GLFrameBufferObj::GLFrameBufferObj
                ((GLFrameBufferObj *)&rt,true,RTAttachmentRef._4_4_);
      GLObjectWrappers::GLFrameBufferObj::operator=(&this->m_DefaultFBO,(GLFrameBufferObj *)&rt);
      GLObjectWrappers::GLFrameBufferObj::~GLFrameBufferObj((GLFrameBufferObj *)&rt);
    }
    GLContextState::BindFBO(&this->m_ContextState,&this->m_DefaultFBO);
    this->m_DrawFBO = (GLFrameBufferObj *)0x0;
  }
  else {
    GLContextState::BindFBO(&this->m_ContextState,&pSStack_a0->RenderTarget);
    this->m_DrawFBO = &pSStack_a0->RenderTarget;
    this->m_DrawBuffersCommitted = false;
  }
  for (RTAttachmentRef._0_4_ = 0; (uint)RTAttachmentRef < FBDesc->AttachmentCount;
      RTAttachmentRef._0_4_ = (uint)RTAttachmentRef + 1) {
    ppIVar8 = FBDesc->ppAttachments + (uint)RTAttachmentRef;
    if ((*(uint *)ppIVar8 != 0xffffffff) &&
       (pTVar9 = ClassPtrCast<Diligent::TextureViewGLImpl,Diligent::ITextureView>
                           (*(ITextureView **)
                             (*(long *)&RenderTargetFBO[1].
                                        super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>
                                        .m_CreateReleaseHelper + (ulong)*(uint *)ppIVar8 * 8)),
       pTVar9 != (TextureViewGLImpl *)0x0)) {
      pTVar10 = TextureViewBase<Diligent::EngineGLImplTraits>::GetTexture<Diligent::TextureBaseGL>
                          (&pTVar9->super_TextureViewBase<Diligent::EngineGLImplTraits>);
      TextureBaseGL::TextureMemoryBarrier(pTVar10,MEMORY_BARRIER_FRAMEBUFFER,&this->m_ContextState);
      lVar2 = *(long *)(msg_2.field_2._8_8_ + 0x10);
      uVar1 = *(uint *)ppIVar8;
      pRVar11 = &RefCntAutoPtr<Diligent::RenderPassGLImpl>::operator->
                           (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                             m_pActiveRenderPass)->
                 super_RenderPassBase<Diligent::EngineGLImplTraits>;
      pVar12 = RenderPassBase<Diligent::EngineGLImplTraits>::GetAttachmentFirstLastUse
                         (pRVar11,*(Uint32 *)ppIVar8);
      uStack_e8 = pVar12.first;
      if ((uStack_e8 == (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex
          ) && (*(char *)(lVar2 + (ulong)uVar1 * 0x10 + 3) == '\x01')) {
        pvVar13 = std::
                  vector<Diligent::OptimizedClearValue,_std::allocator<Diligent::OptimizedClearValue>_>
                  ::operator[](&this->m_AttachmentClearValues,(ulong)*(uint *)ppIVar8);
        ClearRenderTarget(this,(ITextureView *)pTVar9,pvVar13->Color,
                          RESOURCE_STATE_TRANSITION_MODE_NONE);
      }
    }
  }
  if (((*(long *)&FBDesc->NumArraySlices != 0) &&
      (uVar1 = **(uint **)&FBDesc->NumArraySlices, uVar1 != 0xffffffff)) &&
     (pTVar9 = ClassPtrCast<Diligent::TextureViewGLImpl,Diligent::ITextureView>
                         (*(ITextureView **)
                           (*(long *)&RenderTargetFBO[1].
                                      super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>
                                      .m_CreateReleaseHelper + (ulong)uVar1 * 8)),
     pTVar9 != (TextureViewGLImpl *)0x0)) {
    pTVar10 = TextureViewBase<Diligent::EngineGLImplTraits>::GetTexture<Diligent::TextureBaseGL>
                        (&pTVar9->super_TextureViewBase<Diligent::EngineGLImplTraits>);
    TextureBaseGL::TextureMemoryBarrier(pTVar10,MEMORY_BARRIER_FRAMEBUFFER,&this->m_ContextState);
    FirstLastUse_1 =
         (pair<unsigned_int,_unsigned_int>)
         (*(long *)(msg_2.field_2._8_8_ + 0x10) + (ulong)uVar1 * 0x10);
    pRVar11 = &RefCntAutoPtr<Diligent::RenderPassGLImpl>::operator->
                         (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                           m_pActiveRenderPass)->super_RenderPassBase<Diligent::EngineGLImplTraits>;
    FmtAttribs = (TextureFormatAttribs *)
                 RenderPassBase<Diligent::EngineGLImplTraits>::GetAttachmentFirstLastUse
                           (pRVar11,uVar1);
    if (((uint)FmtAttribs ==
         (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex) &&
       (*(char *)((long)FirstLastUse_1 + 3) == '\x01')) {
      pTStack_118 = GetTextureFormatAttribs(*(TEXTURE_FORMAT *)FirstLastUse_1);
      ClearVal._4_4_ = CLEAR_DEPTH_FLAG;
      if (pTStack_118->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL) {
        operator|=((CLEAR_DEPTH_STENCIL_FLAGS *)((long)&ClearVal + 4),CLEAR_STENCIL_FLAG);
      }
      pvVar13 = std::
                vector<Diligent::OptimizedClearValue,_std::allocator<Diligent::OptimizedClearValue>_>
                ::operator[](&this->m_AttachmentClearValues,(ulong)uVar1);
      ClearDepthStencil(this,(ITextureView *)pTVar9,ClearVal._4_4_,
                        (float)(pvVar13->DepthStencil).Depth,(pvVar13->DepthStencil).Stencil,
                        RESOURCE_STATE_TRANSITION_MODE_NONE);
    }
  }
  return;
}

Assistant:

void DeviceContextGLImpl::BeginSubpass()
{
    VERIFY_EXPR(m_pActiveRenderPass);
    VERIFY_EXPR(m_pBoundFramebuffer);
    const RenderPassDesc& RPDesc = m_pActiveRenderPass->GetDesc();
    VERIFY_EXPR(m_SubpassIndex < RPDesc.SubpassCount);
    const SubpassDesc&     SubpassDesc = RPDesc.pSubpasses[m_SubpassIndex];
    const FramebufferDesc& FBDesc      = m_pBoundFramebuffer->GetDesc();

    GLObjectWrappers::GLFrameBufferObj& RenderTargetFBO = m_pBoundFramebuffer->GetSubpassFramebuffer(m_SubpassIndex).RenderTarget;
    if (RenderTargetFBO != 0)
    {
        m_ContextState.BindFBO(RenderTargetFBO);
        m_DrawFBO              = &RenderTargetFBO;
        m_DrawBuffersCommitted = false;
    }
    else
    {
        GLuint DefaultFBOHandle = m_pSwapChain->GetDefaultFBO();
        if (m_DefaultFBO != DefaultFBOHandle)
        {
            m_DefaultFBO = GLObjectWrappers::GLFrameBufferObj{true, GLObjectWrappers::GLFBOCreateReleaseHelper{DefaultFBOHandle}};
        }
        m_ContextState.BindFBO(m_DefaultFBO);
        m_DrawFBO = nullptr;
    }


    for (Uint32 rt = 0; rt < SubpassDesc.RenderTargetAttachmentCount; ++rt)
    {
        const AttachmentReference& RTAttachmentRef = SubpassDesc.pRenderTargetAttachments[rt];
        if (RTAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
        {
            TextureViewGLImpl* const pRTV = ClassPtrCast<TextureViewGLImpl>(FBDesc.ppAttachments[RTAttachmentRef.AttachmentIndex]);
            if (pRTV == nullptr)
                continue;

            TextureBaseGL* const pColorTexGL = pRTV->GetTexture<TextureBaseGL>();
            pColorTexGL->TextureMemoryBarrier(
                MEMORY_BARRIER_FRAMEBUFFER, // Reads and writes via framebuffer object attachments after the
                                            // barrier will reflect data written by shaders prior to the barrier.
                                            // Additionally, framebuffer writes issued after the barrier will wait
                                            // on the completion of all shader writes issued prior to the barrier.
                m_ContextState);

            const RenderPassAttachmentDesc& AttachmentDesc = RPDesc.pAttachments[RTAttachmentRef.AttachmentIndex];
            auto                            FirstLastUse   = m_pActiveRenderPass->GetAttachmentFirstLastUse(RTAttachmentRef.AttachmentIndex);
            if (FirstLastUse.first == m_SubpassIndex && AttachmentDesc.LoadOp == ATTACHMENT_LOAD_OP_CLEAR)
            {
                ClearRenderTarget(pRTV, m_AttachmentClearValues[RTAttachmentRef.AttachmentIndex].Color, RESOURCE_STATE_TRANSITION_MODE_NONE);
            }
        }
    }

    if (SubpassDesc.pDepthStencilAttachment != nullptr)
    {
        const Uint32 DepthAttachmentIndex = SubpassDesc.pDepthStencilAttachment->AttachmentIndex;
        if (DepthAttachmentIndex != ATTACHMENT_UNUSED)
        {
            TextureViewGLImpl* const pDSV = ClassPtrCast<TextureViewGLImpl>(FBDesc.ppAttachments[DepthAttachmentIndex]);
            if (pDSV != nullptr)
            {
                TextureBaseGL* pDepthTexGL = pDSV->GetTexture<TextureBaseGL>();
                pDepthTexGL->TextureMemoryBarrier(MEMORY_BARRIER_FRAMEBUFFER, m_ContextState);

                const RenderPassAttachmentDesc& AttachmentDesc = RPDesc.pAttachments[DepthAttachmentIndex];
                auto                            FirstLastUse   = m_pActiveRenderPass->GetAttachmentFirstLastUse(DepthAttachmentIndex);
                if (FirstLastUse.first == m_SubpassIndex && AttachmentDesc.LoadOp == ATTACHMENT_LOAD_OP_CLEAR)
                {
                    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(AttachmentDesc.Format);

                    CLEAR_DEPTH_STENCIL_FLAGS ClearFlags = CLEAR_DEPTH_FLAG;
                    if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
                        ClearFlags |= CLEAR_STENCIL_FLAG;

                    const DepthStencilClearValue& ClearVal = m_AttachmentClearValues[DepthAttachmentIndex].DepthStencil;
                    ClearDepthStencil(pDSV, ClearFlags, ClearVal.Depth, ClearVal.Stencil, RESOURCE_STATE_TRANSITION_MODE_NONE);
                }
            }
        }
    }
}